

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Partition::Dump(Partition *this,FILE *stream)

{
  undefined8 uVar1;
  char *pcVar2;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  Partition *this_local;
  
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  KLVPacket::Dump((KLVPacket *)this,(FILE *)identbuf._120_8_,this->m_Dict,false);
  fprintf((FILE *)identbuf._120_8_,"  MajorVersion       = %hu\n",(ulong)this->MajorVersion);
  fprintf((FILE *)identbuf._120_8_,"  MinorVersion       = %hu\n",(ulong)this->MinorVersion);
  fprintf((FILE *)identbuf._120_8_,"  KAGSize            = %u\n",(ulong)this->KAGSize);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->ThisPartition,local_98);
  fprintf((FILE *)uVar1,"  ThisPartition      = %s\n",pcVar2);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->PreviousPartition,local_98);
  fprintf((FILE *)uVar1,"  PreviousPartition  = %s\n",pcVar2);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->FooterPartition,local_98);
  fprintf((FILE *)uVar1,"  FooterPartition    = %s\n",pcVar2);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->HeaderByteCount,local_98);
  fprintf((FILE *)uVar1,"  HeaderByteCount    = %s\n",pcVar2);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->IndexByteCount,local_98);
  fprintf((FILE *)uVar1,"  IndexByteCount     = %s\n",pcVar2);
  fprintf((FILE *)identbuf._120_8_,"  IndexSID           = %u\n",(ulong)this->IndexSID);
  uVar1 = identbuf._120_8_;
  pcVar2 = ui64sz(this->BodyOffset,local_98);
  fprintf((FILE *)uVar1,"  BodyOffset         = %s\n",pcVar2);
  fprintf((FILE *)identbuf._120_8_,"  BodySID            = %u\n",(ulong)this->BodySID);
  uVar1 = identbuf._120_8_;
  pcVar2 = UL::EncodeString(&this->OperationalPattern,local_98,0x80);
  fprintf((FILE *)uVar1,"  OperationalPattern = %s\n",pcVar2);
  fputs("Essence Containers:\n",(FILE *)identbuf._120_8_);
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Dump
            (&(this->EssenceContainers).
              super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>,
             (FILE *)identbuf._120_8_,0);
  return;
}

Assistant:

void
ASDCP::MXF::Partition::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  KLVFilePacket::Dump(stream, *m_Dict, false);
  fprintf(stream, "  MajorVersion       = %hu\n", MajorVersion);
  fprintf(stream, "  MinorVersion       = %hu\n", MinorVersion);
  fprintf(stream, "  KAGSize            = %u\n",  KAGSize);
  fprintf(stream, "  ThisPartition      = %s\n",  ui64sz(ThisPartition, identbuf));
  fprintf(stream, "  PreviousPartition  = %s\n",  ui64sz(PreviousPartition, identbuf));
  fprintf(stream, "  FooterPartition    = %s\n",  ui64sz(FooterPartition, identbuf));
  fprintf(stream, "  HeaderByteCount    = %s\n",  ui64sz(HeaderByteCount, identbuf));
  fprintf(stream, "  IndexByteCount     = %s\n",  ui64sz(IndexByteCount, identbuf));
  fprintf(stream, "  IndexSID           = %u\n",  IndexSID);
  fprintf(stream, "  BodyOffset         = %s\n",  ui64sz(BodyOffset, identbuf));
  fprintf(stream, "  BodySID            = %u\n",  BodySID);
  fprintf(stream, "  OperationalPattern = %s\n",  OperationalPattern.EncodeString(identbuf, IdentBufferLen));
  fputs("Essence Containers:\n", stream); EssenceContainers.Dump(stream);
}